

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

char * google::protobuf::compiler::java::BoxedPrimitiveTypeName(JavaType type)

{
  LogMessage *other;
  LogFinisher local_5d [13];
  LogMessage local_50;
  JavaType local_14;
  char *pcStack_10;
  JavaType type_local;
  
  switch(type) {
  case JAVATYPE_INT:
    pcStack_10 = "java.lang.Integer";
    break;
  case JAVATYPE_LONG:
    pcStack_10 = "java.lang.Long";
    break;
  case JAVATYPE_FLOAT:
    pcStack_10 = "java.lang.Float";
    break;
  case JAVATYPE_DOUBLE:
    pcStack_10 = "java.lang.Double";
    break;
  case JAVATYPE_BOOLEAN:
    pcStack_10 = "java.lang.Boolean";
    break;
  case JAVATYPE_STRING:
    pcStack_10 = "java.lang.String";
    break;
  case JAVATYPE_BYTES:
    pcStack_10 = "com.google.protobuf.ByteString";
    break;
  case JAVATYPE_ENUM:
    pcStack_10 = (char *)0x0;
    break;
  case JAVATYPE_MESSAGE:
    pcStack_10 = (char *)0x0;
    break;
  default:
    local_14 = type;
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x1d1);
    other = internal::LogMessage::operator<<(&local_50,"Can\'t get here.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* BoxedPrimitiveTypeName(JavaType type) {
  switch (type) {
    case JAVATYPE_INT:
      return "java.lang.Integer";
    case JAVATYPE_LONG:
      return "java.lang.Long";
    case JAVATYPE_FLOAT:
      return "java.lang.Float";
    case JAVATYPE_DOUBLE:
      return "java.lang.Double";
    case JAVATYPE_BOOLEAN:
      return "java.lang.Boolean";
    case JAVATYPE_STRING:
      return "java.lang.String";
    case JAVATYPE_BYTES:
      return "com.google.protobuf.ByteString";
    case JAVATYPE_ENUM:
      return NULL;
    case JAVATYPE_MESSAGE:
      return NULL;

      // No default because we want the compiler to complain if any new
      // JavaTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}